

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HMPLoader.cpp
# Opt level: O3

bool __thiscall
Assimp::HMPImporter::CanRead(HMPImporter *this,string *pFile,IOSystem *pIOHandler,bool cs)

{
  bool bVar1;
  int iVar2;
  string extension;
  uint32_t tokens [3];
  string local_50;
  undefined8 local_2c;
  undefined4 local_24;
  
  BaseImporter::GetExtension(&local_50,pFile);
  iVar2 = std::__cxx11::string::compare((char *)&local_50);
  if (iVar2 == 0) {
    bVar1 = true;
  }
  else if (local_50._M_string_length == 0 || cs) {
    local_2c = 0x35504d4834504d48;
    local_24 = 0x37504d48;
    bVar1 = BaseImporter::CheckMagicToken(pIOHandler,pFile,&local_2c,3,0,4);
  }
  else {
    bVar1 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return bVar1;
}

Assistant:

bool HMPImporter::CanRead( const std::string& pFile, IOSystem* pIOHandler, bool cs) const
{
    const std::string extension = GetExtension(pFile);
    if (extension == "hmp" )
        return true;

    // if check for extension is not enough, check for the magic tokens
    if (!extension.length() || cs) {
        uint32_t tokens[3];
        tokens[0] = AI_HMP_MAGIC_NUMBER_LE_4;
        tokens[1] = AI_HMP_MAGIC_NUMBER_LE_5;
        tokens[2] = AI_HMP_MAGIC_NUMBER_LE_7;
        return CheckMagicToken(pIOHandler,pFile,tokens,3,0);
    }
    return false;
}